

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O0

char * deqp::gles3::Functional::UniformInfoQueryCase::getCaseTypeName(CaseType caseType)

{
  char *pcStack_10;
  CaseType caseType_local;
  
  if (caseType == CASETYPE_UNIFORM) {
    pcStack_10 = "active_uniform";
  }
  else if (caseType == CASETYPE_INDICES_UNIFORMSIV) {
    pcStack_10 = "indices_active_uniformsiv";
  }
  else if (caseType == CASETYPE_CONSISTENCY) {
    pcStack_10 = "consistency";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* UniformInfoQueryCase::getCaseTypeName (const CaseType caseType)
{
	switch (caseType)
	{
		case CASETYPE_UNIFORM:				return "active_uniform";
		case CASETYPE_INDICES_UNIFORMSIV:	return "indices_active_uniformsiv";
		case CASETYPE_CONSISTENCY:			return "consistency";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}